

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

VkImageAspectFlags __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::getImageAspectFlags
          (ImageClearingTestInstance *this,VkFormat format)

{
  bool bVar1;
  undefined4 local_18;
  VkImageAspectFlags imageAspectFlags;
  VkFormat format_local;
  ImageClearingTestInstance *this_local;
  
  local_18 = 0;
  bVar1 = getIsDepthFormat(this,format);
  if (bVar1) {
    local_18 = 2;
  }
  bVar1 = getIsStencilFormat(this,format);
  if (bVar1) {
    local_18 = local_18 | 4;
  }
  if (local_18 == 0) {
    local_18 = 1;
  }
  return local_18;
}

Assistant:

VkImageAspectFlags ImageClearingTestInstance::getImageAspectFlags (VkFormat format) const
{
	VkImageAspectFlags	imageAspectFlags	= 0;

	if (getIsDepthFormat(format))
		imageAspectFlags |= VK_IMAGE_ASPECT_DEPTH_BIT;

	if (getIsStencilFormat(format))
		imageAspectFlags |= VK_IMAGE_ASPECT_STENCIL_BIT;

	if (imageAspectFlags == 0)
		imageAspectFlags = VK_IMAGE_ASPECT_COLOR_BIT;

	return imageAspectFlags;
}